

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O3

string * tinyusdz::io::GetFileExtension(string *__return_storage_ptr__,string *FileName)

{
  long lVar1;
  
  lVar1 = ::std::__cxx11::string::find_last_of((char *)FileName,0x3a10cb,0xffffffffffffffff);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    ::std::__cxx11::string::find_last_of((char *)FileName,0x3a10cb,0xffffffffffffffff);
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)FileName);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileExtension(const std::string &FileName) {
  if (FileName.find_last_of(".") != std::string::npos)
    return FileName.substr(FileName.find_last_of(".") + 1);
  return "";
}